

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmodelserialiser.cpp
# Opt level: O2

bool __thiscall JsonModelSerialiser::saveModel(JsonModelSerialiser *this,QString *destination)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  byte bVar4;
  QJsonDocument jDoc;
  QJsonDocument local_60 [8];
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char> local_38;
  
  if ((destination == (QString *)0x0) ||
     (((this->super_AbstractStringSerialiser).super_AbstractModelSerialiser.d_ptr.d)->m_constModel
      == (QAbstractItemModel *)0x0)) {
    bVar4 = 0;
  }
  else {
    (**(code **)(*(long *)&(this->super_AbstractStringSerialiser).super_AbstractModelSerialiser +
                0xd0))(&local_58);
    QJsonDocument::QJsonDocument(local_60,(QJsonObject *)&local_58);
    QJsonObject::~QJsonObject((QJsonObject *)&local_58);
    bVar4 = QJsonDocument::isNull();
    if (bVar4 == 0) {
      QJsonDocument::toJson((JsonFormat)&local_38);
      QString::fromUtf8<void>((QString *)&local_58,(QByteArray *)&local_38);
      pDVar2 = (destination->d).d;
      pcVar3 = (destination->d).ptr;
      (destination->d).d = local_58.d;
      (destination->d).ptr = local_58.ptr;
      qVar1 = (destination->d).size;
      (destination->d).size = local_58.size;
      local_58.d = pDVar2;
      local_58.ptr = pcVar3;
      local_58.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
    }
    bVar4 = bVar4 ^ 1;
    QJsonDocument::~QJsonDocument(local_60);
  }
  return (bool)bVar4;
}

Assistant:

bool JsonModelSerialiser::saveModel(QString *destination) const
{
    if (!destination)
        return false;
    Q_D(const JsonModelSerialiser);
    if (!d->m_constModel)
        return false;
    const QJsonDocument jDoc(toJsonObject());
    if (jDoc.isNull())
        return false;
    *destination = QString::fromUtf8(jDoc.toJson(d->m_format));
    return true;
}